

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O2

exp_number __thiscall
ising::free_energy::square::transfer_matrix<float>::product_U
          (transfer_matrix<float> *this,uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<float,_std::allocator<float>_> *v,vector<float,_std::allocator<float>_> *v_10,
          vector<float,_std::allocator<float>_> *v_20,vector<float,_std::allocator<float>_> *v_01,
          vector<float,_std::allocator<float>_> *v_02,vector<float,_std::allocator<float>_> *vt)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  uint_t s;
  uint_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  uVar10 = (ulong)(1 << ((byte)Ly & 0x1f));
  fVar11 = expf(Jx * beta);
  fVar12 = expf(-beta * Jx);
  for (uVar6 = 0; uVar6 != Ly; uVar6 = uVar6 + 1) {
    uVar9 = (ulong)(1 << ((byte)uVar6 & 0x1f));
    pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = uVar7 ^ uVar9;
      pfVar4[uVar7] =
           pfVar3[uVar7] * fVar11 + pfVar3[uVar8] * fVar12 +
           (pfVar1[uVar7] * fVar11 + pfVar1[uVar8] * fVar12) * Jx * Jx +
           (pfVar2[uVar7] * fVar11 + pfVar2[uVar8] * -fVar12) * (Jx + Jx);
    }
    std::_Vector_base<float,_std::allocator<float>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_20,(_Vector_impl_data *)vt);
    pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pfVar3[uVar7] =
           pfVar2[uVar7] * fVar11 + pfVar2[uVar7 ^ uVar9] * fVar12 +
           (pfVar1[uVar7] * fVar11 + pfVar1[uVar7 ^ uVar9] * -fVar12) * Jx;
    }
    std::_Vector_base<float,_std::allocator<float>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_10,(_Vector_impl_data *)vt);
    pfVar1 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pfVar2[uVar7] = pfVar1[uVar7] * fVar11 + pfVar1[uVar7 ^ uVar9] * fVar12;
    }
    std::_Vector_base<float,_std::allocator<float>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_02,(_Vector_impl_data *)vt);
    pfVar1 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pfVar2[uVar7] = pfVar1[uVar7] * fVar11 + pfVar1[uVar7 ^ uVar9] * fVar12;
    }
    std::_Vector_base<float,_std::allocator<float>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_01,(_Vector_impl_data *)vt);
    pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pfVar2[uVar7] = pfVar1[uVar7] * fVar11 + pfVar1[uVar7 ^ uVar9] * fVar12;
    }
    std::_Vector_base<float,_std::allocator<float>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v,(_Vector_impl_data *)vt);
  }
  fVar11 = 0.0;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    fVar12 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start[uVar7];
    fVar11 = fVar11 + fVar12 * fVar12;
  }
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  fVar11 = 1.0 / fVar11;
  pfVar1 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar3 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar4 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pfVar1[uVar7] = pfVar1[uVar7] * fVar11;
    pfVar2[uVar7] = pfVar2[uVar7] * fVar11;
    pfVar3[uVar7] = pfVar3[uVar7] * fVar11;
    pfVar4[uVar7] = pfVar4[uVar7] * fVar11;
    pfVar5[uVar7] = pfVar5[uVar7] * fVar11;
  }
  standards::operator/((standards *)this,factor,fVar11);
  return (exp_number)this;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }